

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

bool __thiscall wasm::Literal::isSignedMin(Literal *this)

{
  BasicType BVar1;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if ((BVar1 != i64) && (BVar1 != i32)) {
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                       ,0x95);
  }
  return false;
}

Assistant:

bool isSignedMin() const {
    switch (type.getBasic()) {
      case Type::i32:
        return i32 == std::numeric_limits<int32_t>::min();
      case Type::i64:
        return i64 == std::numeric_limits<int64_t>::min();
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }